

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

Vec3fa __thiscall
embree::motion_derivative_regression_test::random_axis(motion_derivative_regression_test *this)

{
  long in_RSI;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_float>
  __aurng;
  float fVar1;
  float fVar2;
  float fVar6;
  float fVar7;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar8;
  float fVar9;
  Vec3fa VVar10;
  
  fVar1 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)(in_RSI + 0x28));
  fVar2 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)(in_RSI + 0x28));
  fVar9 = fVar1 + 0.0 + fVar1 + 0.0 + -1.0;
  fVar2 = fVar2 + 0.0 + fVar2 + 0.0 + -1.0;
  fVar1 = 0.0;
  if (fVar9 * fVar9 + fVar2 * fVar2 <= 0.995) {
    fVar1 = (1.0 - fVar9 * fVar9) - fVar2 * fVar2;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
  }
  fVar6 = fVar2 * fVar2;
  fVar7 = fVar1 * fVar1;
  fVar8 = fVar6 + fVar9 * fVar9 + fVar7;
  VVar10.field_0._12_4_ = fVar6 + fVar6 + 0.0;
  fVar7 = fVar6 + fVar7 + fVar7;
  fVar6 = fVar6 + 0.0 + 0.0;
  auVar3._4_4_ = VVar10.field_0._12_4_;
  auVar3._0_4_ = fVar8;
  auVar3._8_4_ = fVar7;
  auVar3._12_4_ = fVar6;
  auVar4._4_4_ = VVar10.field_0._12_4_;
  auVar4._0_4_ = fVar8;
  auVar4._8_4_ = fVar7;
  auVar4._12_4_ = fVar6;
  auVar4 = rsqrtss(auVar3,auVar4);
  fVar6 = auVar4._0_4_;
  VVar10.field_0._8_4_ = fVar8 * -0.5 * fVar6;
  fVar6 = fVar6 * fVar6 * VVar10.field_0._8_4_ + fVar6 * 1.5;
  auVar5._0_8_ = CONCAT44(fVar6 * fVar2,fVar6 * fVar9);
  auVar5._8_4_ = fVar6 * fVar1;
  auVar5._12_4_ = fVar6 * 0.0;
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)auVar5._0_8_;
  (this->super_RegressionTest).name._M_dataplus = (_Alloc_hider)auVar5._8_8_;
  VVar10.field_0._0_8_ = auVar5._0_8_;
  return (Vec3fa)VVar10.field_0;
}

Assistant:

inline Vec3fa random_axis()
    {
      float x = 2.f * rand01() - 1.f;
      float y = 2.f * rand01() - 1.f;
      float z = x*x+y*y > 0.995 ? 0.f : std::sqrt(1 - x*x - y*y);
      Vec3fa axis(x, y, z);
      return normalize(axis);
    }